

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O0

CURLcode cw_out_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t blen)

{
  cw_out_ctx *ctx_00;
  bool flush_all_00;
  _Bool flush_all;
  CURLcode result;
  cw_out_ctx *ctx;
  size_t blen_local;
  char *buf_local;
  int type_local;
  Curl_cwriter *writer_local;
  Curl_easy *data_local;
  
  ctx_00 = (cw_out_ctx *)writer->ctx;
  flush_all_00 = (type & 0x80U) != 0;
  if (((((type & 1U) == 0) &&
       (((type & 4U) == 0 || ((*(ulong *)&(data->set).field_0x89c >> 0x1a & 1) == 0)))) ||
      (data_local._4_4_ = cw_out_do_write(ctx_00,data,CW_OUT_BODY,flush_all_00,buf,blen),
      data_local._4_4_ == CURLE_OK)) &&
     (((type & 6U) == 0 ||
      (data_local._4_4_ = cw_out_do_write(ctx_00,data,CW_OUT_HDS,flush_all_00,buf,blen),
      data_local._4_4_ == CURLE_OK)))) {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode cw_out_write(struct Curl_easy *data,
                             struct Curl_cwriter *writer, int type,
                             const char *buf, size_t blen)
{
  struct cw_out_ctx *ctx = writer->ctx;
  CURLcode result;
  bool flush_all = !!(type & CLIENTWRITE_EOS);

  if((type & CLIENTWRITE_BODY) ||
     ((type & CLIENTWRITE_HEADER) && data->set.include_header)) {
    result = cw_out_do_write(ctx, data, CW_OUT_BODY, flush_all, buf, blen);
    if(result)
      return result;
  }

  if(type & (CLIENTWRITE_HEADER|CLIENTWRITE_INFO)) {
    result = cw_out_do_write(ctx, data, CW_OUT_HDS, flush_all, buf, blen);
    if(result)
      return result;
  }

  return CURLE_OK;
}